

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.cpp
# Opt level: O2

void __thiscall
LiteScript::_Type_CLASS::GarbageCollector
          (_Type_CLASS *this,Variable *object,offset_in_Memory_to_subr caller)

{
  Class *this_00;
  pointer pVVar1;
  pointer pVVar2;
  char cVar3;
  uint uVar4;
  Object *pOVar5;
  long in_RCX;
  uint i;
  int iVar6;
  uint op;
  uint uVar7;
  long *plVar8;
  ulong uVar9;
  code *pcVar10;
  pointer local_38;
  
  pOVar5 = Variable::operator->(object);
  plVar8 = (long *)((long)(pOVar5->memory->arr)._M_elems + in_RCX);
  pcVar10 = (code *)caller;
  if ((caller & 1) != 0) {
    pcVar10 = *(code **)(*plVar8 + -1 + caller);
  }
  pOVar5 = Variable::operator->(object);
  cVar3 = (*pcVar10)(plVar8,pOVar5->ID);
  if (cVar3 == '\0') {
    pOVar5 = Variable::operator->(object);
    this_00 = (Class *)pOVar5->data;
    local_38 = (pointer)Class::GetInherits(this_00);
    pVVar1 = (pointer)local_38->nb_ref;
    pVVar2 = (((_Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *)
              &local_38->obj)->_M_impl).super__Vector_impl_data._M_start;
    for (uVar9 = 0; ((long)pVVar1 - (long)pVVar2 & 0xffffffff0U) != uVar9; uVar9 = uVar9 + 0x10) {
      Variable::Variable((Variable *)&stack0xffffffffffffffb8,
                         (Variable *)
                         ((long)&((((_Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                                     *)&local_38->obj)->_M_impl).super__Vector_impl_data._M_start)->
                                 obj + uVar9));
      Variable::GarbageCollector((Variable *)&stack0xffffffffffffffb8,caller);
      Variable::~Variable((Variable *)&stack0xffffffffffffffb8);
    }
    uVar4 = Class::GetStaticCount(this_00);
    for (uVar7 = 0; op = (uint)this_00, uVar4 != uVar7; uVar7 = uVar7 + 1) {
      Class::GetStaticMember((Class *)&stack0xffffffffffffffb8,op);
      Variable::GarbageCollector((Variable *)&stack0xffffffffffffffb8,caller);
      Variable::~Variable((Variable *)&stack0xffffffffffffffb8);
    }
    uVar4 = Class::GetUnstaticCount(this_00);
    for (uVar7 = 0; uVar4 != uVar7; uVar7 = uVar7 + 1) {
      Class::GetUnstaticMember((Class *)&stack0xffffffffffffffb8,op);
      Variable::GarbageCollector((Variable *)&stack0xffffffffffffffb8,caller);
      Variable::~Variable((Variable *)&stack0xffffffffffffffb8);
    }
    for (iVar6 = 0; iVar6 != 0x21; iVar6 = iVar6 + 1) {
      Class::GetOperator((Class *)&stack0xffffffffffffffb8,op);
      Variable::GarbageCollector((Variable *)&stack0xffffffffffffffb8,caller);
      Variable::~Variable((Variable *)&stack0xffffffffffffffb8);
    }
  }
  return;
}

Assistant:

void LiteScript::_Type_CLASS::GarbageCollector(const Variable &object, bool (Memory::*caller)(unsigned int)) const {
    if ((object->memory.*caller)(object->ID))
        return;
    const Class& C = object->GetData<Class>();
    const std::vector<LiteScript::Variable>& inherits = C.GetInherits();
    for (unsigned int i = 0, sz = inherits.size(); i < sz; i++)
        Variable(inherits[i]).GarbageCollector(caller);
    for (unsigned int i = 0, sz = C.GetStaticCount(); i < sz; i++)
        C.GetStaticMember(i).GarbageCollector(caller);
    for (unsigned int i = 0, sz = C.GetUnstaticCount(); i < sz; i++)
        C.GetUnstaticMember(i).GarbageCollector(caller);
    for (unsigned int i = 0, sz = Class::OperatorType::OP_TYPE_NUMBER; i < sz; i++)
        C.GetOperator(i).GarbageCollector(caller);
}